

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void compileoptiongetFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  char *z;
  
  uVar1 = sqlite3VdbeIntValue(*argv);
  if ((uVar1 & 0xfffffff8) == 0) {
    z = sqlite3azCompileOpt[(uint)uVar1 & 7];
  }
  else {
    z = (char *)0x0;
  }
  sqlite3_result_text(context,z,-1,(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

static void compileoptiongetFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int n;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  /* IMP: R-04922-24076 The sqlite_compileoption_get() SQL function
  ** is a wrapper around the sqlite3_compileoption_get() C/C++ function.
  */
  n = sqlite3_value_int(argv[0]);
  sqlite3_result_text(context, sqlite3_compileoption_get(n), -1, SQLITE_STATIC);
}